

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::Compaction::AddInputDeletions(Compaction *this,VersionEdit *edit)

{
  bool bVar1;
  bool bVar2;
  pointer ppFVar3;
  ulong uVar4;
  long lVar5;
  pair<int,_unsigned_long> local_40;
  
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    ppFVar3 = this->inputs_[lVar5].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this->inputs_[lVar5].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar3) {
      uVar4 = 0;
      do {
        local_40.first = this->level_ + (int)lVar5;
        local_40.second = ppFVar3[uVar4]->number;
        std::
        _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
        ::_M_insert_unique<std::pair<int,unsigned_long>>
                  ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                    *)&edit->deleted_files_,&local_40);
        uVar4 = uVar4 + 1;
        ppFVar3 = this->inputs_[lVar5].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)this->inputs_[lVar5].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3
                              ));
    }
    lVar5 = 1;
    bVar2 = false;
  } while (bVar1);
  return;
}

Assistant:

void Compaction::AddInputDeletions(VersionEdit* edit) {
  for (int which = 0; which < 2; which++) {
    for (size_t i = 0; i < inputs_[which].size(); i++) {
      edit->RemoveFile(level_ + which, inputs_[which][i]->number);
    }
  }
}